

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::SSARewriter::GetReachingDef(SSARewriter *this,uint32_t var_id,BasicBlock *bb)

{
  uint32_t uVar1;
  CFG *pCVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  ulong uVar4;
  BasicBlock *bb_00;
  PhiCandidate *phi_candidate;
  
  uVar1 = GetValueAtBlock(this,var_id,bb);
  if (uVar1 != 0) {
    return uVar1;
  }
  pCVar2 = Pass::cfg(&this->pass_->super_Pass);
  uVar1 = BasicBlock::id(bb);
  pvVar3 = CFG::preds(pCVar2,uVar1);
  uVar4 = (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 4) {
    pCVar2 = Pass::cfg(&this->pass_->super_Pass);
    bb_00 = CFG::block(pCVar2,*(pvVar3->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start);
    uVar1 = GetReachingDef(this,var_id,bb_00);
LAB_0018d6d1:
    if (uVar1 != 0) goto LAB_0018d6ed;
  }
  else if (4 < uVar4) {
    phi_candidate = CreatePhiCandidate(this,var_id,bb);
    WriteVariable(this,var_id,bb,phi_candidate->result_id_);
    uVar1 = AddPhiOperands(this,phi_candidate);
    goto LAB_0018d6d1;
  }
  uVar1 = MemPass::GetUndefVal(this->pass_,var_id);
  if (uVar1 == 0) {
    return 0;
  }
LAB_0018d6ed:
  WriteVariable(this,var_id,bb,uVar1);
  return uVar1;
}

Assistant:

uint32_t SSARewriter::GetReachingDef(uint32_t var_id, BasicBlock* bb) {
  // If |var_id| has a definition in |bb|, return it.
  uint32_t val_id = GetValueAtBlock(var_id, bb);
  if (val_id != 0) return val_id;

  // Otherwise, look up the value for |var_id| in |bb|'s predecessors.
  auto& predecessors = pass_->cfg()->preds(bb->id());
  if (predecessors.size() == 1) {
    // If |bb| has exactly one predecessor, we look for |var_id|'s definition
    // there.
    val_id = GetReachingDef(var_id, pass_->cfg()->block(predecessors[0]));
  } else if (predecessors.size() > 1) {
    // If there is more than one predecessor, this is a join block which may
    // require a Phi instruction.  This will act as |var_id|'s current
    // definition to break potential cycles.
    PhiCandidate& phi_candidate = CreatePhiCandidate(var_id, bb);

    // Set the value for |bb| to avoid an infinite recursion.
    WriteVariable(var_id, bb, phi_candidate.result_id());
    val_id = AddPhiOperands(&phi_candidate);
  }

  // If we could not find a store for this variable in the path from the root
  // of the CFG, the variable is not defined, so we use undef.
  if (val_id == 0) {
    val_id = pass_->GetUndefVal(var_id);
    if (val_id == 0) {
      return 0;
    }
  }

  WriteVariable(var_id, bb, val_id);

  return val_id;
}